

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_priority_search.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::
priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
::priority_search_nearest_euclidean
          (void *param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4,undefined8 param_5
          ,undefined8 param_6)

{
  *(undefined8 *)param_1 = param_2;
  *(undefined8 *)((long)param_1 + 0x10) = param_3;
  *(undefined8 *)((long)param_1 + 0x18) = param_4;
  *(undefined8 *)((long)param_1 + 0x20) = param_5;
  ::std::
  priority_queue<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::vector<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::allocator<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>,std::greater<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>
  ::
  priority_queue<std::vector<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::allocator<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>,void>
            ((priority_queue<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::vector<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>,_std::greater<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
              *)param_1);
  *(undefined8 *)((long)param_1 + 0x48) = param_6;
  return;
}

Assistant:

inline priority_search_nearest_euclidean(
      SpaceWrapper_ space,
      Metric_ metric,
      std::vector<index_type> const& indices,
      PointWrapper_ query,
      size_t max_leaves_visited,
      Visitor_& visitor)
      : space_(space),
        metric_(metric),
        indices_(indices),
        query_(query),
        max_leaves_visited_(max_leaves_visited),
        visitor_(visitor) {}